

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_chasm_bin.cpp
# Opt level: O0

FResourceLump * __thiscall FChasmBinFile::MakeRawSoundLump(FChasmBinFile *this,ChasmBinEntry *entry)

{
  FileReader *pFVar1;
  int iVar2;
  MemoryLump *this_00;
  char *__dest;
  undefined4 extraout_var;
  long savedPos;
  char *buffer;
  MemoryLump *lump;
  int local_48;
  WaveHeader header;
  size_t waveFileSize;
  ChasmBinEntry *entry_local;
  FChasmBinFile *this_local;
  
  header.data = (DataHeader)((ulong)entry->size + 0x2c);
  lump._4_4_ = 0x46464952;
  local_48 = header.data.fourCC - 8;
  header.riff.fourCC = 0x45564157;
  header.riff.size = 0x20746d66;
  header.wave = 0x10;
  header.format.fourCC._0_2_ = 1;
  header.format.fourCC._2_2_ = 1;
  header.format.size = 0x2b11;
  header.format.audioFormat = 0x2b11;
  header.format.channels = 0;
  header.format.sampleRate._0_2_ = 1;
  header.format.sampleRate._2_2_ = 8;
  header.format.byteRate = 0x61746164;
  header.format._20_4_ = entry->size;
  this_00 = (MemoryLump *)operator_new(0x60);
  anon_unknown.dwarf_6a53ed::MemoryLump::MemoryLump(this_00,(size_t)header.data);
  (this_00->super_FResourceLump).Namespace = 0xd;
  __dest = anon_unknown.dwarf_6a53ed::MemoryLump::GetBuffer(this_00);
  memcpy(__dest,(void *)((long)&lump + 4),0x2c);
  iVar2 = (*(((this->super_FResourceFile).Reader)->super_FileReaderBase)._vptr_FileReaderBase[3])();
  pFVar1 = (this->super_FResourceFile).Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(ulong)entry->offset,0);
  pFVar1 = (this->super_FResourceFile).Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,__dest + 0x2c,(ulong)entry->size)
  ;
  pFVar1 = (this->super_FResourceFile).Reader;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,CONCAT44(extraout_var,iVar2),0);
  AddEntryToSoundInfo(this,entry);
  return &this_00->super_FResourceLump;
}

Assistant:

FResourceLump* FChasmBinFile::MakeRawSoundLump(const ChasmBinEntry& entry)
{
	const size_t waveFileSize = sizeof(WaveHeader) + entry.size;

	// All RAW audio files are in the same format:
	// 11025 Hz, mono, 8 bits, uncompressed

	const WaveHeader header =
	{
		// RiffHeader
		{
			MAKE_ID('R', 'I', 'F', 'F'),
			static_cast<DWORD>(waveFileSize - sizeof(RiffHeader))
		},
		MAKE_ID('W', 'A', 'V', 'E'),
		// FormatHeader
		{
			MAKE_ID('f', 'm', 't', ' '),
			FORMAT_HEADER_SIZE,
			1,     // PCM audio format
			1,     // channels
			11025, // sample rate
			11025, // byte rate
			1,     // block alignment
			8,     // bits per sample;
		},
		// DataHeader
		{
			MAKE_ID('d', 'a', 't', 'a'),
			entry.size
		}
	};

	MemoryLump* lump = new MemoryLump(waveFileSize);
	lump->Namespace = ns_sounds;

	char* buffer = lump->GetBuffer();
	
	memcpy(buffer, &header, sizeof header);
	buffer += sizeof header;

	const long savedPos = Reader->Tell();

	Reader->Seek(entry.offset, SEEK_SET);
	Reader->Read(buffer, entry.size);
	Reader->Seek(savedPos, SEEK_SET);

	AddEntryToSoundInfo(entry);

	return lump;
}